

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O3

double PopulationCost(uint32_t *population,int length,uint32_t *trivial_sym,uint8_t *is_used)

{
  uint32_t uVar1;
  double dVar2;
  VP8LBitEntropy bit_entropy;
  VP8LStreaks stats;
  VP8LBitEntropy local_48;
  VP8LStreaks local_30;
  
  (*VP8LGetEntropyUnrefined)(population,length,&local_48,&local_30);
  if (trivial_sym != (uint32_t *)0x0) {
    uVar1 = 0xffffffff;
    if (local_48.nonzeros == 1) {
      uVar1 = local_48.nonzero_code;
    }
    *trivial_sym = uVar1;
  }
  *is_used = local_30.streaks[1][0] != 0 || local_30.streaks[1][1] != 0;
  if (local_48.nonzeros < 5) {
    dVar2 = 0.0;
    if (local_48.nonzeros < 2) goto LAB_00141694;
    if (local_48.nonzeros == 3) {
      dVar2 = 0.95;
    }
    else {
      if (local_48.nonzeros == 2) {
        dVar2 = (double)local_48.sum * 0.99 + local_48.entropy * 0.01;
        goto LAB_00141694;
      }
      dVar2 = 0.7;
    }
  }
  else {
    dVar2 = 0.627;
  }
  dVar2 = (double)(local_48.sum * 2 - local_48.max_val) * dVar2 + (1.0 - dVar2) * local_48.entropy;
  if (dVar2 <= local_48.entropy) {
    dVar2 = local_48.entropy;
  }
LAB_00141694:
  return (double)local_30.streaks[1][0] * 3.28125 +
         (double)local_30.streaks[0][0] * 1.796875 +
         (double)local_30.counts[1] * 2.578125 + (double)local_30.streaks[1][1] * 0.703125 +
         (double)local_30.counts[0] * 1.5625 + (double)local_30.streaks[0][1] * 0.234375 + 47.9 +
         dVar2;
}

Assistant:

static double PopulationCost(const uint32_t* const population, int length,
                             uint32_t* const trivial_sym,
                             uint8_t* const is_used) {
  VP8LBitEntropy bit_entropy;
  VP8LStreaks stats;
  VP8LGetEntropyUnrefined(population, length, &bit_entropy, &stats);
  if (trivial_sym != NULL) {
    *trivial_sym = (bit_entropy.nonzeros == 1) ? bit_entropy.nonzero_code
                                               : VP8L_NON_TRIVIAL_SYM;
  }
  // The histogram is used if there is at least one non-zero streak.
  *is_used = (stats.streaks[1][0] != 0 || stats.streaks[1][1] != 0);

  return BitsEntropyRefine(&bit_entropy) + FinalHuffmanCost(&stats);
}